

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O3

InplaceStr GetUnsizedArrayTypeName(ExpressionContext *ctx,TypeBase *type)

{
  char *__src;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  InplaceStr IVar5;
  
  uVar4 = (*(int *)&(type->name).end - *(int *)&(type->name).begin) + 3;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar4);
  IVar5.begin = (char *)CONCAT44(extraout_var,iVar1);
  __src = (type->name).begin;
  memcpy(IVar5.begin,__src,(ulong)(uint)(*(int *)&(type->name).end - (int)__src));
  uVar2 = (ulong)(uint)(*(int *)&(type->name).end - *(int *)&(type->name).begin);
  (IVar5.begin + uVar2)[0] = '[';
  (IVar5.begin + uVar2)[1] = ']';
  IVar5.begin[uVar2 + 2] = '\0';
  sVar3 = strlen(IVar5.begin);
  if (sVar3 + 1 == (ulong)uVar4) {
    IVar5.end = IVar5.begin + sVar3;
    return IVar5;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0xb4,"InplaceStr GetUnsizedArrayTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetUnsizedArrayTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned nameLength = type->name.length() + unsigned(strlen("[]")) + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, type->name.begin, type->name.length());
	pos += type->name.length();

	memcpy(pos, "[]", 2);
	pos += 2;

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}